

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_fixed(URLGlob *glob,char *fixed,size_t len)

{
  URLPattern *pUVar1;
  char **ppcVar2;
  char *pcVar3;
  URLPattern *pat;
  size_t len_local;
  char *fixed_local;
  URLGlob *glob_local;
  
  pUVar1 = glob->pattern + glob->size;
  pUVar1->type = UPTSet;
  (pUVar1->content).Set.size = 1;
  (pUVar1->content).Set.ptr_s = 0;
  pUVar1->globindex = -1;
  ppcVar2 = (char **)malloc(8);
  (pUVar1->content).Set.elements = ppcVar2;
  if ((pUVar1->content).Set.elements == (char **)0x0) {
    glob->error = "out of memory";
    glob->pos = 0;
    glob_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar3 = (char *)malloc(len + 1);
    *(pUVar1->content).Set.elements = pcVar3;
    if (*(pUVar1->content).Set.elements == (char *)0x0) {
      glob->error = "out of memory";
      glob->pos = 0;
      glob_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      memcpy(*(pUVar1->content).Set.elements,fixed,len);
      (*(pUVar1->content).Set.elements)[len] = '\0';
      glob_local._4_4_ = CURLE_OK;
    }
  }
  return glob_local._4_4_;
}

Assistant:

static CURLcode glob_fixed(struct URLGlob *glob, char *fixed, size_t len)
{
  struct URLPattern *pat = &glob->pattern[glob->size];
  pat->type = UPTSet;
  pat->content.Set.size = 1;
  pat->content.Set.ptr_s = 0;
  pat->globindex = -1;

  pat->content.Set.elements = malloc(sizeof(char *));

  if(!pat->content.Set.elements)
    return GLOBERROR("out of memory", 0, CURLE_OUT_OF_MEMORY);

  pat->content.Set.elements[0] = malloc(len + 1);
  if(!pat->content.Set.elements[0])
    return GLOBERROR("out of memory", 0, CURLE_OUT_OF_MEMORY);

  memcpy(pat->content.Set.elements[0], fixed, len);
  pat->content.Set.elements[0][len] = 0;

  return CURLE_OK;
}